

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,double value)

{
  bool bVar1;
  allocator local_3d;
  int local_3c;
  char local_38 [4];
  int len;
  char buffer [32];
  double value_local;
  
  local_3c = 0xffffffff;
  buffer._24_8_ = value;
  bVar1 = std::isfinite(value);
  if (bVar1) {
    local_3c = snprintf(local_38,0x20,"%.16g",buffer._24_8_);
  }
  else if (NAN((double)buffer._24_8_)) {
    local_3c = snprintf(local_38,0x20,"null");
  }
  else if (0.0 <= (double)buffer._24_8_) {
    local_3c = snprintf(local_38,0x20,"1e+9999");
  }
  else {
    local_3c = snprintf(local_38,0x20,"-1e+9999");
  }
  if (-1 < local_3c) {
    fixNumericLocale(local_38,local_38 + local_3c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_38,&local_3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
    return __return_storage_ptr__;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0x88,"std::string Json::valueToString(double)");
}

Assistant:

std::string valueToString(double value) {
  // Allocate a buffer that is more than large enough to store the 16 digits of
  // precision requested below.
  char buffer[32];
  int len = -1;

// Print into the buffer. We need not request the alternative representation
// that always has a decimal point because JSON doesn't distingish the
// concepts of reals and integers.
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__) // Use secure version with
                                                      // visual studio 2005 to
                                                      // avoid warning.
#if defined(WINCE)
  len = _snprintf(buffer, sizeof(buffer), "%.16g", value);
#else
  len = sprintf_s(buffer, sizeof(buffer), "%.16g", value);
#endif
#else
  if (isfinite(value)) {
    len = snprintf(buffer, sizeof(buffer), "%.16g", value);
  } else {
    // IEEE standard states that NaN values will not compare to themselves
    if (value != value) {
      len = snprintf(buffer, sizeof(buffer), "null");
    } else if (value < 0) {
      len = snprintf(buffer, sizeof(buffer), "-1e+9999");
    } else {
      len = snprintf(buffer, sizeof(buffer), "1e+9999");
    }
    // For those, we do not need to call fixNumLoc, but it is fast.
  }
#endif
  assert(len >= 0);
  fixNumericLocale(buffer, buffer + len);
  return buffer;
}